

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void DoFilter4_C(uint8_t *p,int step)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  int iVar6;
  int a3;
  int a2;
  int a1;
  int a;
  int q1;
  int q0;
  int p0;
  int p1;
  int step_local;
  uint8_t *p_local;
  
  bVar1 = p[-step];
  bVar2 = *p;
  bVar3 = p[step];
  iVar6 = ((uint)bVar2 - (uint)bVar1) * 3;
  uVar4 = sclip2[(long)(iVar6 + 4 >> 3) + 0x70];
  uVar5 = sclip2[(long)(iVar6 + 3 >> 3) + 0x70];
  iVar6 = (char)uVar4 + 1 >> 1;
  p[step * -2] = ""[(long)(int)((uint)p[step * -2] + iVar6) + 0xff];
  p[-step] = ""[(long)(int)((uint)bVar1 + (int)(char)uVar5) + 0xff];
  *p = ""[(long)(int)((uint)bVar2 - (int)(char)uVar4) + 0xff];
  p[step] = ""[(long)(int)((uint)bVar3 - iVar6) + 0xff];
  return;
}

Assistant:

static WEBP_INLINE void DoFilter4_C(uint8_t* p, int step) {
  const int p1 = p[-2*step], p0 = p[-step], q0 = p[0], q1 = p[step];
  const int a = 3 * (q0 - p0);
  const int a1 = VP8ksclip2[(a + 4) >> 3];
  const int a2 = VP8ksclip2[(a + 3) >> 3];
  const int a3 = (a1 + 1) >> 1;
  p[-2*step] = VP8kclip1[p1 + a3];
  p[-  step] = VP8kclip1[p0 + a2];
  p[      0] = VP8kclip1[q0 - a1];
  p[   step] = VP8kclip1[q1 - a3];
}